

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4161a3::ConversionExpr::printLeft(ConversionExpr *this,OutputStream *S)

{
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ConversionExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Type,local_18);
  StringView::StringView(&local_38,")(");
  OutputStream::operator+=(local_18,local_38);
  NodeArray::printWithComma(&this->Expressions,local_18);
  StringView::StringView(&local_48,")");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Type->print(S);
    S += ")(";
    Expressions.printWithComma(S);
    S += ")";
  }